

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

void trigger_user_callback(pa_stream *s,void *input_data,size_t nbytes,cubeb_stream_conflict *stm)

{
  float fVar1;
  pa_context *ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _func_pa_time_event_ptr_pa_context_ptr_pa_usec_t_pa_time_event_cb_t_void_ptr *p_Var5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  pa_usec_t pVar11;
  pa_time_event *ppVar12;
  ulong uVar13;
  long lVar14;
  size_t size;
  void *buffer;
  pa_usec_t latency;
  size_t local_58;
  pa_stream *local_50;
  void *local_48;
  pa_usec_t local_40;
  pa_sample_spec *local_38;
  
  local_50 = s;
  sVar7 = (*cubeb_pa_frame_size)(&stm->output_sample_spec);
  if (nbytes != 0) {
    local_38 = &stm->input_sample_spec;
    lVar14 = 0;
    do {
      local_58 = nbytes;
      (*cubeb_pa_stream_begin_write)(local_50,&local_48,&local_58);
      if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) &&
         (CUBEB_LOG_NORMAL < g_cubeb_log_level)) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Trigger user callback with output buffer size=%zd, read_offset=%zd\n",
                   "cubeb_pulse.c",0x10f,local_58,lVar14);
      }
      uVar8 = (*stm->data_callback)
                        (stm,stm->user_ptr,(void *)((long)input_data + lVar14),local_48,
                         local_58 / sVar7);
      if ((long)uVar8 < 0) {
        (*cubeb_pa_stream_cancel_write)(local_50);
LAB_00108804:
        stm->shutdown = 1;
        return;
      }
      if (input_data != (void *)0x0) {
        sVar9 = (*cubeb_pa_frame_size)(local_38);
        lVar14 = lVar14 + (local_58 / sVar7) * sVar9;
      }
      fVar1 = stm->volume;
      if ((fVar1 != -1.0) || (NAN(fVar1))) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = sVar7;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (stm->output_sample_spec).channels * local_58;
        uVar10 = SUB168(auVar4 / auVar3,0);
        iVar6 = SUB164(auVar4 / auVar3,0);
        if ((uint)((stm->output_sample_spec).format + ~PA_SAMPLE_ULAW) < 2) {
          if (iVar6 != 0) {
            uVar13 = 0;
            do {
              *(short *)((long)local_48 + uVar13 * 2) =
                   (short)(int)((float)(int)*(short *)((long)local_48 + uVar13 * 2) * fVar1);
              uVar13 = uVar13 + 1;
            } while (uVar13 < (uVar10 & 0xffffffff));
          }
        }
        else if (iVar6 != 0) {
          uVar13 = 0;
          do {
            *(float *)((long)local_48 + uVar13 * 4) =
                 stm->volume * *(float *)((long)local_48 + uVar13 * 4);
            uVar13 = uVar13 + 1;
          } while (uVar13 < (uVar10 & 0xffffffff));
        }
      }
      (*cubeb_pa_stream_write)(local_50,local_48,uVar8 * sVar7,(pa_free_cb_t)0x0,0,PA_SEEK_RELATIVE)
      ;
      if (uVar8 < local_58 / sVar7) {
        local_40 = 0;
        iVar6 = (*cubeb_pa_stream_get_latency)(local_50,&local_40,(int *)0x0);
        p_Var5 = cubeb_pa_context_rttime_new;
        if (iVar6 == -0x10) {
          local_40 = 100000;
        }
        ppVar2 = stm->context->context;
        pVar11 = (*cubeb_pa_rtclock_now)();
        ppVar12 = (*p_Var5)(ppVar2,pVar11 + local_40 * 2,stream_drain_callback,stm);
        stm->drain_timer = ppVar12;
        goto LAB_00108804;
      }
      nbytes = nbytes - local_58;
    } while (nbytes != 0);
  }
  return;
}

Assistant:

static void
trigger_user_callback(pa_stream * s, void const * input_data, size_t nbytes, cubeb_stream * stm)
{
  void * buffer;
  size_t size;
  int r;
  long got;
  size_t towrite, read_offset;
  size_t frame_size;

  frame_size = WRAP(pa_frame_size)(&stm->output_sample_spec);
  assert(nbytes % frame_size == 0);

  towrite = nbytes;
  read_offset = 0;
  while (towrite) {
    size = towrite;
    r = WRAP(pa_stream_begin_write)(s, &buffer, &size);
    // Note: this has failed running under rr on occassion - needs investigation.
    assert(r == 0);
    assert(size > 0);
    assert(size % frame_size == 0);

    LOGV("Trigger user callback with output buffer size=%zd, read_offset=%zd", size, read_offset);
    got = stm->data_callback(stm, stm->user_ptr, (uint8_t const *)input_data + read_offset, buffer, size / frame_size);
    if (got < 0) {
      WRAP(pa_stream_cancel_write)(s);
      stm->shutdown = 1;
      return;
    }
    // If more iterations move offset of read buffer
    if (input_data) {
      size_t in_frame_size = WRAP(pa_frame_size)(&stm->input_sample_spec);
      read_offset += (size / frame_size) * in_frame_size;
    }

    if (stm->volume != PULSE_NO_GAIN) {
      uint32_t samples =  size * stm->output_sample_spec.channels / frame_size ;

      if (stm->output_sample_spec.format == PA_SAMPLE_S16BE ||
          stm->output_sample_spec.format == PA_SAMPLE_S16LE) {
        short * b = buffer;
        for (uint32_t i = 0; i < samples; i++) {
          b[i] *= stm->volume;
        }
      } else {
        float * b = buffer;
        for (uint32_t i = 0; i < samples; i++) {
          b[i] *= stm->volume;
        }
      }
    }

    r = WRAP(pa_stream_write)(s, buffer, got * frame_size, NULL, 0, PA_SEEK_RELATIVE);
    assert(r == 0);

    if ((size_t) got < size / frame_size) {
      pa_usec_t latency = 0;
      r = WRAP(pa_stream_get_latency)(s, &latency, NULL);
      if (r == -PA_ERR_NODATA) {
        /* this needs a better guess. */
        latency = 100 * PA_USEC_PER_MSEC;
      }
      assert(r == 0 || r == -PA_ERR_NODATA);
      /* pa_stream_drain is useless, see PA bug# 866. this is a workaround. */
      /* arbitrary safety margin: double the current latency. */
      assert(!stm->drain_timer);
      stm->drain_timer = WRAP(pa_context_rttime_new)(stm->context->context, WRAP(pa_rtclock_now)() + 2 * latency, stream_drain_callback, stm);
      stm->shutdown = 1;
      return;
    }

    towrite -= size;
  }

  assert(towrite == 0);
}